

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

void Curl_resolver_kill(Curl_easy *data)

{
  undefined1 *puVar1;
  thread_data *hnd;
  
  hnd = (data->state).async.tdata;
  if (((hnd != (thread_data *)0x0) && (hnd->thread_hnd != (pthread_t *)0x0)) &&
     (((data->set).field_0x8ca & 0x40) == 0)) {
    Curl_thread_join(&hnd->thread_hnd);
    puVar1 = &(data->state).async.field_0x28;
    *puVar1 = *puVar1 | 1;
  }
  destroy_async_data(&(data->state).async);
  return;
}

Assistant:

void Curl_resolver_kill(struct Curl_easy *data)
{
  struct thread_data *td = data->state.async.tdata;

  /* If we are still resolving, we must wait for the threads to fully clean up,
     unfortunately. Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(td && td->thread_hnd != curl_thread_t_null
     && (data->set.quick_exit != 1L))
    (void)thread_wait_resolv(data, NULL, FALSE);
  else
    Curl_resolver_cancel(data);
}